

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O1

axbStatus_t op_mat_csr_tvec(axbMat_s *A,axbVec_s *x,axbVec_s *ATx,void *aux_data)

{
  double dVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  void *__s;
  size_t sVar8;
  size_t sVar9;
  long lVar10;
  long lVar11;
  
  pvVar4 = A->row_markers;
  pvVar5 = A->col_indices;
  pvVar6 = A->values;
  pvVar7 = x->data;
  __s = ATx->data;
  if (A->cols != 0) {
    memset(__s,0,A->cols << 3);
  }
  sVar8 = A->rows;
  if (sVar8 != 0) {
    sVar9 = 0;
    do {
      iVar2 = *(int *)((long)pvVar4 + sVar9 * 4);
      lVar10 = (long)iVar2;
      iVar3 = *(int *)((long)pvVar4 + sVar9 * 4 + 4);
      if (iVar2 < iVar3) {
        dVar1 = *(double *)((long)pvVar7 + sVar9 * 8);
        do {
          lVar11 = (long)*(int *)((long)pvVar5 + lVar10 * 4);
          *(double *)((long)__s + lVar11 * 8) =
               *(double *)((long)pvVar6 + lVar10 * 8) * dVar1 + *(double *)((long)__s + lVar11 * 8);
          lVar10 = lVar10 + 1;
        } while (iVar3 != lVar10);
      }
      sVar9 = sVar9 + 1;
    } while (sVar9 != sVar8);
  }
  return 0;
}

Assistant:

static axbStatus_t op_mat_csr_tvec(struct axbMat_s *A, struct axbVec_s *x, struct axbVec_s *ATx, void *aux_data)
{
  (void)aux_data;

  const int    *A_row_markers = (const int*)A->row_markers;
  const int    *A_col_indices = (const int*)A->col_indices;
  const double *A_values      = (const double*)A->values;
  const double *d_x           = (const double*)x->data;

  double *d_ATx = (double*)ATx->data;

  for (size_t i=0; i<A->cols; ++i) d_ATx[i] = 0;

  for (size_t i=0; i<A->rows; ++i) {
    double xi = d_x[i];
    for (int j=A_row_markers[i]; j < A_row_markers[i+1]; ++j) {
      d_ATx[A_col_indices[j]] += A_values[j] * xi;
    }
  }

  return 0;
}